

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdown.cpp
# Opt level: O0

void __thiscall markdown::Document::Document(Document *this,size_t spacesPerTab)

{
  Container *this_00;
  LinkIds *this_01;
  list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
  local_38;
  size_t local_18;
  size_t spacesPerTab_local;
  Document *this_local;
  
  this->cSpacesPerTab = spacesPerTab;
  local_18 = spacesPerTab;
  spacesPerTab_local = (size_t)this;
  this_00 = (Container *)operator_new(0x28);
  local_38.
  super__List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  local_38.
  super__List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  local_38.
  super__List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
  ._M_impl._M_node._M_size = 0;
  std::__cxx11::
  list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>::
  list(&local_38);
  token::Container::Container(this_00,&local_38);
  boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::Container>
            (&this->mTokenContainer,this_00);
  std::__cxx11::
  list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>::
  ~list(&local_38);
  this_01 = (LinkIds *)operator_new(0x30);
  LinkIds::LinkIds(this_01);
  this->mIdTable = this_01;
  this->mProcessed = false;
  return;
}

Assistant:

Document::Document(size_t spacesPerTab): cSpacesPerTab(spacesPerTab),
	mTokenContainer(new token::Container), mIdTable(new LinkIds),
	mProcessed(false)
{
	// This space deliberately blank ;-)
}